

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_8x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar22 [16];
  short sVar27;
  short sVar29;
  undefined1 auVar28 [16];
  short sVar30;
  ushort uVar31;
  ushort uVar32;
  short sVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 in_XMM3 [16];
  undefined1 auVar33 [16];
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 in_XMM4 [16];
  
  auVar22 = pshuflw(ZEXT116(left_column[3]),ZEXT116(left_column[3]),0);
  auVar28._0_2_ = auVar22._0_2_;
  sVar27 = auVar22._2_2_;
  auVar28._2_2_ = sVar27 * 0x6b;
  auVar28._4_2_ = auVar28._0_2_ * 0xab;
  auVar28._6_2_ = sVar27 * 0xc0;
  auVar28._8_2_ = auVar28._0_2_ * 0x100;
  auVar28._10_2_ = sVar27 * 0x100;
  auVar28._12_2_ = auVar28._0_2_ * 0x100;
  auVar28._14_2_ = sVar27 * 0x100;
  uVar1 = *(ulong *)top_row;
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xe] = (char)(uVar1 >> 0x38);
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xc] = (char)(uVar1 >> 0x30);
  auVar11._13_2_ = auVar10._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar11._12_3_;
  auVar13._8_2_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13[10] = (char)(uVar1 >> 0x28);
  auVar13._11_4_ = auVar12._11_4_;
  auVar14._8_2_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._10_5_ = auVar13._10_5_;
  auVar15[8] = (char)(uVar1 >> 0x20);
  auVar15._0_8_ = uVar1;
  auVar15._9_6_ = auVar14._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar15._8_7_;
  Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar20._9_6_ = 0;
  auVar20._0_9_ = Var17;
  auVar18._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar18[0] = (char)(uVar1 >> 0x10);
  auVar21._11_4_ = 0;
  auVar21._0_11_ = auVar18;
  auVar19._1_12_ = SUB1512(auVar21 << 0x20,3);
  auVar19[0] = (char)(uVar1 >> 8);
  auVar22._0_2_ = CONCAT11(0,(byte)uVar1);
  auVar22._2_13_ = auVar19;
  auVar22[0xf] = 0;
  sVar27 = auVar19._0_2_;
  sVar29 = auVar18._0_2_;
  sVar23 = (short)Var17;
  sVar24 = auVar15._8_2_;
  sVar25 = auVar13._10_2_;
  sVar26 = auVar11._12_2_;
  uVar49 = auVar10._13_2_ >> 8;
  auVar33 = pshuflw(in_XMM3,auVar28,0);
  sVar30 = auVar33._0_2_ + 0x80;
  sVar34 = auVar33._2_2_ + 0x80;
  uVar31 = sVar30 + auVar22._0_2_ * 0xff;
  uVar35 = sVar34 + sVar27 * 0xff;
  uVar37 = sVar30 + sVar29 * 0xff;
  uVar39 = sVar34 + sVar23 * 0xff;
  uVar41 = sVar30 + sVar24 * 0xff;
  uVar43 = sVar34 + sVar25 * 0xff;
  uVar45 = sVar30 + sVar26 * 0xff;
  uVar47 = sVar34 + uVar49 * 0xff;
  uVar32 = uVar31 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  uVar40 = uVar39 >> 8;
  uVar42 = uVar41 >> 8;
  uVar44 = uVar43 >> 8;
  uVar46 = uVar45 >> 8;
  uVar48 = uVar47 >> 8;
  *(ulong *)dst =
       CONCAT17((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                         CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                  (0xff < uVar44),
                                  CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                           (0xff < uVar42),
                                           CONCAT13((uVar40 != 0) * (uVar40 < 0x100) *
                                                    (char)(uVar39 >> 8) - (0xff < uVar40),
                                                    CONCAT12((uVar38 != 0) * (uVar38 < 0x100) *
                                                             (char)(uVar37 >> 8) - (0xff < uVar38),
                                                             CONCAT11((uVar36 != 0) *
                                                                      (uVar36 < 0x100) *
                                                                      (char)(uVar35 >> 8) -
                                                                      (0xff < uVar36),
                                                                      (uVar32 != 0) *
                                                                      (uVar32 < 0x100) *
                                                                      (char)(uVar31 >> 8) -
                                                                      (0xff < uVar32))))))));
  auVar33 = pshuflw(in_XMM4,auVar28,0x55);
  sVar30 = auVar33._0_2_ + 0x80;
  sVar34 = auVar33._2_2_ + 0x80;
  uVar31 = sVar30 + auVar22._0_2_ * 0x95;
  uVar35 = sVar34 + sVar27 * 0x95;
  uVar37 = sVar30 + sVar29 * 0x95;
  uVar39 = sVar34 + sVar23 * 0x95;
  uVar41 = sVar30 + sVar24 * 0x95;
  uVar43 = sVar34 + sVar25 * 0x95;
  uVar45 = sVar30 + sVar26 * 0x95;
  uVar47 = sVar34 + uVar49 * 0x95;
  uVar32 = uVar31 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  uVar40 = uVar39 >> 8;
  uVar42 = uVar41 >> 8;
  uVar44 = uVar43 >> 8;
  uVar46 = uVar45 >> 8;
  uVar48 = uVar47 >> 8;
  cVar2 = (char)(uVar31 >> 8);
  cVar3 = (char)(uVar35 >> 8);
  cVar4 = (char)(uVar37 >> 8);
  cVar5 = (char)(uVar39 >> 8);
  cVar6 = (char)(uVar41 >> 8);
  cVar7 = (char)(uVar43 >> 8);
  cVar8 = (char)(uVar45 >> 8);
  cVar9 = (char)(uVar47 >> 8);
  auVar33._0_8_ =
       CONCAT17((uVar48 != 0) * (uVar48 < 0x100) * cVar9 - (0xff < uVar48),
                CONCAT16((uVar46 != 0) * (uVar46 < 0x100) * cVar8 - (0xff < uVar46),
                         CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * cVar7 - (0xff < uVar44),
                                  CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * cVar6 -
                                           (0xff < uVar42),
                                           CONCAT13((uVar40 != 0) * (uVar40 < 0x100) * cVar5 -
                                                    (0xff < uVar40),
                                                    CONCAT12((uVar38 != 0) * (uVar38 < 0x100) *
                                                             cVar4 - (0xff < uVar38),
                                                             CONCAT11((uVar36 != 0) *
                                                                      (uVar36 < 0x100) * cVar3 -
                                                                      (0xff < uVar36),
                                                                      (uVar32 != 0) *
                                                                      (uVar32 < 0x100) * cVar2 -
                                                                      (0xff < uVar32))))))));
  auVar33[8] = (uVar32 != 0) * (uVar32 < 0x100) * cVar2 - (0xff < uVar32);
  auVar33[9] = (uVar36 != 0) * (uVar36 < 0x100) * cVar3 - (0xff < uVar36);
  auVar33[10] = (uVar38 != 0) * (uVar38 < 0x100) * cVar4 - (0xff < uVar38);
  auVar33[0xb] = (uVar40 != 0) * (uVar40 < 0x100) * cVar5 - (0xff < uVar40);
  auVar33[0xc] = (uVar42 != 0) * (uVar42 < 0x100) * cVar6 - (0xff < uVar42);
  auVar33[0xd] = (uVar44 != 0) * (uVar44 < 0x100) * cVar7 - (0xff < uVar44);
  auVar33[0xe] = (uVar46 != 0) * (uVar46 < 0x100) * cVar8 - (0xff < uVar46);
  auVar33[0xf] = (uVar48 != 0) * (uVar48 < 0x100) * cVar9 - (0xff < uVar48);
  *(undefined8 *)(dst + stride) = auVar33._0_8_;
  auVar33 = pshuflw(auVar33,auVar28,0xaa);
  sVar30 = auVar33._0_2_ + 0x80;
  sVar34 = auVar33._2_2_ + 0x80;
  uVar31 = sVar30 + auVar22._0_2_ * 0x55;
  uVar32 = sVar34 + sVar27 * 0x55;
  uVar36 = sVar30 + sVar29 * 0x55;
  uVar38 = sVar34 + sVar23 * 0x55;
  uVar40 = sVar30 + sVar24 * 0x55;
  uVar42 = sVar34 + sVar25 * 0x55;
  uVar44 = sVar30 + sVar26 * 0x55;
  uVar46 = sVar34 + uVar49 * 0x55;
  uVar49 = uVar31 >> 8;
  uVar35 = uVar32 >> 8;
  uVar37 = uVar36 >> 8;
  uVar39 = uVar38 >> 8;
  uVar41 = uVar40 >> 8;
  uVar43 = uVar42 >> 8;
  uVar45 = uVar44 >> 8;
  uVar47 = uVar46 >> 8;
  *(ulong *)(dst + stride * 2) =
       CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                         CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                  (0xff < uVar43),
                                  CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                           (0xff < uVar41),
                                           CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                    (char)(uVar38 >> 8) - (0xff < uVar39),
                                                    CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                             (char)(uVar36 >> 8) - (0xff < uVar37),
                                                             CONCAT11((uVar35 != 0) *
                                                                      (uVar35 < 0x100) *
                                                                      (char)(uVar32 >> 8) -
                                                                      (0xff < uVar35),
                                                                      (uVar49 != 0) *
                                                                      (uVar49 < 0x100) *
                                                                      (char)(uVar31 >> 8) -
                                                                      (0xff < uVar49))))))));
  auVar22 = psllw(auVar22,6);
  auVar28 = pshuflw(auVar28,auVar28,0xff);
  sVar27 = auVar28._0_2_ + 0x80;
  sVar29 = auVar28._2_2_ + 0x80;
  uVar49 = sVar27 + auVar22._0_2_;
  uVar32 = sVar29 + auVar22._2_2_;
  uVar36 = sVar27 + auVar22._4_2_;
  uVar38 = sVar29 + auVar22._6_2_;
  uVar40 = sVar27 + auVar22._8_2_;
  uVar42 = sVar29 + auVar22._10_2_;
  uVar44 = sVar27 + auVar22._12_2_;
  uVar46 = sVar29 + auVar22._14_2_;
  uVar31 = uVar49 >> 8;
  uVar35 = uVar32 >> 8;
  uVar37 = uVar36 >> 8;
  uVar39 = uVar38 >> 8;
  uVar41 = uVar40 >> 8;
  uVar43 = uVar42 >> 8;
  uVar45 = uVar44 >> 8;
  uVar47 = uVar46 >> 8;
  *(ulong *)(dst + stride * 3) =
       CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45),
                         CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) -
                                  (0xff < uVar43),
                                  CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) -
                                           (0xff < uVar41),
                                           CONCAT13((uVar39 != 0) * (uVar39 < 0x100) *
                                                    (char)(uVar38 >> 8) - (0xff < uVar39),
                                                    CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                             (char)(uVar36 >> 8) - (0xff < uVar37),
                                                             CONCAT11((uVar35 != 0) *
                                                                      (uVar35 < 0x100) *
                                                                      (char)(uVar32 >> 8) -
                                                                      (0xff < uVar35),
                                                                      (uVar31 != 0) *
                                                                      (uVar31 < 0x100) *
                                                                      (char)(uVar49 >> 8) -
                                                                      (0xff < uVar31))))))));
  return;
}

Assistant:

void aom_smooth_v_predictor_8x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_select = _mm_set1_epi32(0x01000100);
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
}